

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Disposer::
dispose<kj::Function<bool(capnp::MessageReader&)>::Impl<capnp::_::(anonymous_namespace)::TestCase461::run()::__0&>>
          (Disposer *this,
          Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_test_c__:471:19)_&>
          *object)

{
  _func_int *local_30;
  Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_test_c__:471:19)_&>
  *object_local;
  Disposer *this_local;
  
  if (object == (Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_test_c__:471:19)_&>
                 *)0x0) {
    local_30 = (_func_int *)0x0;
  }
  else {
    local_30 = (object->super_Iface)._vptr_Iface[-2] + (long)&(object->super_Iface)._vptr_Iface;
  }
  (**this->_vptr_Disposer)(this,local_30);
  return;
}

Assistant:

void Disposer::dispose(T* object) const {
  if constexpr (_kj_internal_isPolymorphic((T*)nullptr)) {
    // Note that dynamic_cast<void*> does not require RTTI to be enabled, because the offset to
    // the top of the object is in the vtable -- as it obviously needs to be to correctly implement
    // operator delete.
    disposeImpl(dynamic_cast<void*>(object));
  } else {
    disposeImpl(static_cast<void*>(object));
  }
}